

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

size_t google::protobuf::internal::StringSpaceUsedExcludingSelfLong(string *str)

{
  string *psVar1;
  size_t sVar2;
  size_t sVar3;
  
  psVar1 = (string *)(str->_M_dataplus)._M_p;
  if (psVar1 == (string *)&str->field_2) {
    sVar3 = 0xf;
  }
  else {
    sVar3 = (str->field_2)._M_allocated_capacity;
  }
  sVar2 = 0;
  if (str + 1 <= psVar1) {
    sVar2 = sVar3;
  }
  if (psVar1 < str) {
    sVar2 = sVar3;
  }
  return sVar2;
}

Assistant:

size_t StringSpaceUsedExcludingSelfLong(const std::string& str) {
  const void* start = &str;
  const void* end = &str + 1;
  if (start <= str.data() && str.data() < end) {
    // The string's data is stored inside the string object itself.
    return 0;
  } else {
    return str.capacity();
  }
}